

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfsm-builder.cc
# Opt level: O1

Expression __thiscall
cnn::NonFactoredSoftmaxBuilder::neg_log_softmax
          (NonFactoredSoftmaxBuilder *this,Expression *rep,uint wordidx)

{
  uint in_ECX;
  undefined4 in_register_00000014;
  Expression EVar1;
  initializer_list<cnn::expr::Expression> local_68;
  Expression local_58;
  Expression local_48;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_28;
  undefined4 local_20;
  
  local_48.pg = *(ComputationGraph **)&rep[2].i;
  local_68._M_array = &local_48;
  local_48.i.t = *(uint *)&rep[3].pg;
  local_38 = *(undefined8 *)&rep[1].i;
  local_30 = *(undefined4 *)&rep[2].pg;
  local_28 = *(undefined8 *)CONCAT44(in_register_00000014,wordidx);
  local_20 = *(undefined4 *)((undefined8 *)CONCAT44(in_register_00000014,wordidx) + 1);
  local_68._M_len = 3;
  expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
            ((detail *)&local_58,&local_68);
  EVar1 = expr::pickneglogsoftmax((expr *)this,&local_58,in_ECX);
  EVar1.pg = (ComputationGraph *)this;
  return EVar1;
}

Assistant:

Expression NonFactoredSoftmaxBuilder::neg_log_softmax(const Expression& rep, unsigned wordidx) {
  return pickneglogsoftmax(affine_transform({b, w, rep}), wordidx);
}